

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopStatements.cpp
# Opt level: O1

void __thiscall slang::ast::UnrollVisitor::runForReal(UnrollVisitor *this,ForLoopStatement *loop)

{
  char_pointer puVar1;
  IntervalMap<unsigned_long,_std::monostate,_0U> *this_00;
  AssignmentExpression *pAVar2;
  SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL> *pSVar3;
  size_type sVar4;
  uint uVar5;
  bool bVar6;
  char_pointer puVar7;
  Symbol *args_2;
  undefined8 *puVar8;
  ValueDriver *driver;
  uint uVar9;
  long lVar10;
  table_element_pointer ppVar11;
  undefined8 *puVar12;
  char_pointer puVar13;
  type *expr;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  iterator iVar16;
  iterator iVar17;
  DriverBitRange bounds;
  iterator it;
  char_pointer local_c8;
  const_iterator local_b0;
  iterator local_70;
  
  this->anyErrors = false;
  this->setupMode = false;
  EvalContext::reset(&this->evalCtx);
  EvalContext::pushEmptyFrame(&this->evalCtx);
  if ((loop->super_Statement).kind != Invalid) {
    handle(this,loop);
  }
  if (this->anyErrors == true) {
    iVar16 = boost::unordered::detail::foa::
             table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::AssignmentExpression_*,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>_>,_slang::hash<const_slang::ast::AssignmentExpression_*,_void>,_std::equal_to<const_slang::ast::AssignmentExpression_*>,_std::allocator<std::pair<const_slang::ast::AssignmentExpression_*const,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>_>_>_>
             ::begin(&(this->driverMap).table_);
    if (iVar16.p_ != (table_element_pointer)0x0) {
LAB_003a2cc6:
      pAVar2 = (iVar16.p_)->first;
      Expression::requireLValue
                (pAVar2->left_,this->astCtx,(SourceLocation)0x0,
                 (bitmask<slang::ast::AssignFlags>)
                 (underlying_type)*(undefined4 *)&pAVar2->nonBlocking,(Expression *)0x0);
      puVar7 = iVar16.pc_ + 2;
      do {
        puVar13 = puVar7;
        puVar7 = iVar16.pc_;
        ppVar11 = iVar16.p_ + 1;
        if (((uint)iVar16.pc_ & 0xf) == 0xe) goto LAB_003a2d21;
        puVar1 = puVar13 + -1;
        iVar16.p_ = ppVar11;
        iVar16.pc_ = puVar7 + 1;
        puVar7 = puVar13 + 1;
      } while (*puVar1 == '\0');
      puVar13 = puVar13 + -1;
      if (*puVar1 == '\x01') {
        ppVar11 = (table_element_pointer)0x0;
      }
      goto LAB_003a2d12;
    }
  }
  else {
    args_2 = ASTContext::getContainingSymbol(this->astCtx);
    iVar17 = boost::unordered::detail::foa::
             table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::AssignmentExpression_*,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>_>,_slang::hash<const_slang::ast::AssignmentExpression_*,_void>,_std::equal_to<const_slang::ast::AssignmentExpression_*>,_std::allocator<std::pair<const_slang::ast::AssignmentExpression_*const,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>_>_>_>
             ::begin(&(this->driverMap).table_);
    if (iVar17.p_ != (table_element_pointer)0x0) {
LAB_003a2da1:
      pSVar3 = ((iVar17.p_)->second)._M_t.
               super___uniq_ptr_impl<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_*,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>
               .
               super__Head_base<0UL,_slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_*,_false>
               ._M_head_impl;
      sVar4 = (pSVar3->super_SmallVectorBase<slang::ast::UnrollVisitor::PerAssignDriverState>).len;
      if (sVar4 != 0) {
        puVar12 = &(((pSVar3->super_SmallVectorBase<slang::ast::UnrollVisitor::PerAssignDriverState>
                     ).data_)->longestStaticPrefix).ptr;
        puVar8 = puVar12 + sVar4 * 0x1c;
        do {
          local_b0.map._0_1_ = 0;
          local_70.super_const_iterator.map._0_1_ = 0;
          driver = BumpAllocator::
                   emplace<slang::ast::ValueDriver,slang::ast::DriverKind,slang::ast::Expression_const&,slang::ast::Symbol_const&,slang::ast::AssignFlags>
                             (&this->comp->super_BumpAllocator,(DriverKind *)&local_b0,
                              (Expression *)*puVar12,args_2,(AssignFlags *)&local_70);
          this_00 = (IntervalMap<unsigned_long,_std::monostate,_0U> *)(puVar12 + 3);
          IntervalMap<unsigned_long,_std::monostate,_0U>::begin((iterator *)&local_b0,this_00);
          while( true ) {
            IntervalMap<unsigned_long,_std::monostate,_0U>::end(&local_70,this_00);
            bVar6 = IntervalMapDetails::Path::operator==
                              (&local_b0.path,&local_70.super_const_iterator.path);
            if (local_70.super_const_iterator.path.path.
                super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ !=
                (pointer)local_70.super_const_iterator.path.path.
                         super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.firstElement)
            {
              operator_delete(local_70.super_const_iterator.path.path.
                              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_);
            }
            if (bVar6) break;
            lVar10 = (ulong)local_b0.path.path.
                            super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
                            [local_b0.path.path.
                             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].
                            offset * 0x10;
            bounds.second =
                 *(unsigned_long *)
                  ((long)local_b0.path.path.
                         super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
                         [local_b0.path.path.
                          super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].
                         node + lVar10 + 8);
            bounds.first = *(unsigned_long *)
                            ((long)local_b0.path.path.
                                   super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                                   data_[local_b0.path.path.
                                         super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>
                                         .len - 1].node + lVar10);
            ValueSymbol::addDriver((ValueSymbol *)puVar12[1],bounds,driver);
            IntervalMap<unsigned_long,_std::monostate,_0U>::const_iterator::operator++(&local_b0);
          }
          if (local_b0.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
              != (pointer)local_b0.path.path.
                          super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.firstElement
             ) {
            operator_delete(local_b0.path.path.
                            super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_);
          }
          IntervalMap<unsigned_long,_std::monostate,_0U>::clear
                    (this_00,&this->comp->unrollIntervalMapAllocator);
          puVar12 = puVar12 + 0x1c;
        } while (puVar12 != puVar8);
      }
      local_c8 = iVar17.pc_;
      puVar7 = local_c8 + 2;
      do {
        puVar13 = puVar7;
        puVar7 = iVar17.pc_;
        ppVar11 = iVar17.p_ + 1;
        if (((uint)iVar17.pc_ & 0xf) == 0xe) goto LAB_003a2f05;
        puVar1 = puVar13 + -1;
        iVar17.p_ = ppVar11;
        iVar17.pc_ = puVar7 + 1;
        puVar7 = puVar13 + 1;
      } while (*puVar1 == '\0');
      puVar13 = puVar13 + -1;
      if (*puVar1 == '\x01') {
        ppVar11 = (table_element_pointer)0x0;
      }
      goto LAB_003a2ef6;
    }
  }
  return;
LAB_003a2f05:
  do {
    auVar15[0] = -(*puVar13 == '\0');
    auVar15[1] = -(puVar13[1] == '\0');
    auVar15[2] = -(puVar13[2] == '\0');
    auVar15[3] = -(puVar13[3] == '\0');
    auVar15[4] = -(puVar13[4] == '\0');
    auVar15[5] = -(puVar13[5] == '\0');
    auVar15[6] = -(puVar13[6] == '\0');
    auVar15[7] = -(puVar13[7] == '\0');
    auVar15[8] = -(puVar13[8] == '\0');
    auVar15[9] = -(puVar13[9] == '\0');
    auVar15[10] = -(puVar13[10] == '\0');
    auVar15[0xb] = -(puVar13[0xb] == '\0');
    auVar15[0xc] = -(puVar13[0xc] == '\0');
    auVar15[0xd] = -(puVar13[0xd] == '\0');
    auVar15[0xe] = -(puVar13[0xe] == '\0');
    auVar15[0xf] = -(puVar13[0xf] == '\0');
    uVar9 = (uint)(ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe);
    if (uVar9 == 0x7fff) {
      puVar13 = puVar13 + 0x10;
      ppVar11 = ppVar11 + 0xf;
    }
    else {
      uVar5 = 0;
      if ((uVar9 ^ 0x7fff) != 0) {
        for (; ((uVar9 ^ 0x7fff) >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      if (puVar13[uVar5] == '\x01') {
        ppVar11 = (table_element_pointer)0x0;
      }
      else {
        puVar13 = puVar13 + uVar5;
        ppVar11 = (table_element_pointer)((long)&ppVar11->first + (ulong)(uVar5 << 4));
      }
    }
  } while (uVar9 == 0x7fff);
LAB_003a2ef6:
  iVar17.p_ = ppVar11;
  iVar17.pc_ = puVar13;
  if (ppVar11 == (table_element_pointer)0x0) {
    return;
  }
  goto LAB_003a2da1;
LAB_003a2d21:
  do {
    auVar14[0] = -(*puVar13 == '\0');
    auVar14[1] = -(puVar13[1] == '\0');
    auVar14[2] = -(puVar13[2] == '\0');
    auVar14[3] = -(puVar13[3] == '\0');
    auVar14[4] = -(puVar13[4] == '\0');
    auVar14[5] = -(puVar13[5] == '\0');
    auVar14[6] = -(puVar13[6] == '\0');
    auVar14[7] = -(puVar13[7] == '\0');
    auVar14[8] = -(puVar13[8] == '\0');
    auVar14[9] = -(puVar13[9] == '\0');
    auVar14[10] = -(puVar13[10] == '\0');
    auVar14[0xb] = -(puVar13[0xb] == '\0');
    auVar14[0xc] = -(puVar13[0xc] == '\0');
    auVar14[0xd] = -(puVar13[0xd] == '\0');
    auVar14[0xe] = -(puVar13[0xe] == '\0');
    auVar14[0xf] = -(puVar13[0xf] == '\0');
    uVar9 = (uint)(ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe);
    if (uVar9 == 0x7fff) {
      puVar13 = puVar13 + 0x10;
      ppVar11 = ppVar11 + 0xf;
    }
    else {
      uVar5 = 0;
      if ((uVar9 ^ 0x7fff) != 0) {
        for (; ((uVar9 ^ 0x7fff) >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      if (puVar13[uVar5] == '\x01') {
        ppVar11 = (table_element_pointer)0x0;
      }
      else {
        puVar13 = puVar13 + uVar5;
        ppVar11 = (table_element_pointer)((long)&ppVar11->first + (ulong)(uVar5 << 4));
      }
    }
  } while (uVar9 == 0x7fff);
LAB_003a2d12:
  iVar16.p_ = ppVar11;
  iVar16.pc_ = puVar13;
  if (ppVar11 == (table_element_pointer)0x0) {
    return;
  }
  goto LAB_003a2cc6;
}

Assistant:

void runForReal(const ForLoopStatement& loop) {
        // Revisit the loop with setupMode turned off.
        anyErrors = false;
        setupMode = false;
        evalCtx.reset();
        evalCtx.pushEmptyFrame();
        visit(loop);

        if (anyErrors) {
            // We can't correctly apply our collected intervals if there are errors,
            // so just visit each assignment expression like normal to make sure
            // errors get issued.
            for (auto& [expr, stateVec] : driverMap) {
                auto flags = expr->isNonBlocking() ? AssignFlags::NonBlocking : AssignFlags::None;
                expr->left().requireLValue(astCtx, {}, flags);
            }
        }
        else {
            // Find our finished driver interval maps and apply them.
            auto& containingSym = astCtx.getContainingSymbol();
            for (auto& [expr, stateVec] : driverMap) {
                for (auto& state : *stateVec) {
                    auto driver = comp.emplace<ValueDriver>(DriverKind::Procedural,
                                                            *state.longestStaticPrefix,
                                                            containingSym, AssignFlags::None);

                    for (auto it = state.intervals.begin(); it != state.intervals.end(); ++it)
                        state.symbol->addDriver(it.bounds(), *driver);

                    state.intervals.clear(comp.getUnrollIntervalMapAllocator());
                }
            }
        }
    }